

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_fill_poly_convex
               (nk_draw_list *list,nk_vec2 *points,uint points_count,nk_color color,
               nk_anti_aliasing aliasing)

{
  undefined8 uVar1;
  undefined8 uVar2;
  nk_vec2 uv;
  nk_buffer *b;
  void *pvVar3;
  nk_size nVar4;
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  nk_draw_index nVar9;
  int iVar10;
  void *pvVar11;
  nk_draw_index *pnVar12;
  void *pvVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  float fVar18;
  ulong uVar19;
  nk_draw_index nVar20;
  nk_draw_index nVar21;
  uint uVar22;
  nk_vec2 pos;
  nk_vec2 pos_00;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  nk_size index;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x263a,
                  "void nk_draw_list_fill_poly_convex(struct nk_draw_list *, const struct nk_vec2 *, const unsigned int, struct nk_color, enum nk_anti_aliasing)"
                 );
  }
  if (2 < points_count) {
    iVar10 = (int)((float)((uint)color >> 0x18) * (list->config).global_alpha);
    fVar23 = (float)((uint)color & 0xff) * 0.003921569;
    fVar25 = (float)((uint)color >> 8 & 0xff) * 0.003921569;
    auVar5[0xc] = (char)((uint)iVar10 >> 0x10);
    auVar5._0_12_ = ZEXT812(0);
    auVar6._10_3_ = auVar5._10_3_;
    auVar6._0_10_ = (unkuint10)(byte)((uint)iVar10 >> 8) << 0x40;
    auVar8._5_8_ = 0;
    auVar8._0_5_ = auVar6._8_5_;
    auVar7[5] = 0;
    auVar7._0_5_ = CONCAT14((char)iVar10,(uint)color >> 0x10) & 0xff000000ff;
    auVar7._6_7_ = SUB137(auVar8 << 0x40,6);
    fVar24 = (float)((uint)color >> 0x10 & 0xff) * 0.003921569;
    fVar26 = (float)auVar7._4_4_ * 0.003921569;
    uVar22 = list->vertex_count;
    nVar20 = (nk_draw_index)uVar22;
    if (aliasing == NK_ANTI_ALIASING_ON) {
      pvVar11 = nk_draw_list_alloc_vertices(list,(ulong)(points_count * 2));
      pnVar12 = nk_draw_list_alloc_elements(list,(ulong)(points_count * 9 - 6));
      if (pnVar12 != (nk_draw_index *)0x0 && pvVar11 != (void *)0x0) {
        b = list->vertices;
        pvVar3 = (b->memory).ptr;
        nVar4 = b->allocated;
        b->marker[0].active = 1;
        b->marker[0].offset = nVar4;
        uVar19 = (ulong)points_count;
        pvVar13 = nk_buffer_alloc(b,NK_BUFFER_FRONT,uVar19 * 8,4);
        if (pvVar13 != (void *)0x0) {
          pvVar11 = (void *)((long)pvVar11 + ((long)(list->vertices->memory).ptr - (long)pvVar3));
          lVar14 = uVar19 - 2;
          iVar10 = uVar22 + 2;
          do {
            *pnVar12 = nVar20;
            pnVar12[1] = (nk_draw_index)iVar10;
            iVar10 = iVar10 + 2;
            pnVar12[2] = (nk_draw_index)iVar10;
            pnVar12 = pnVar12 + 3;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
          uVar17 = 0;
          uVar16 = (ulong)(points_count - 1);
          do {
            uVar15 = uVar17;
            fVar28 = points[uVar15].x - points[uVar16].x;
            fVar27 = points[uVar15].y - points[uVar16].y;
            fVar29 = fVar28 * fVar28 + fVar27 * fVar27;
            fVar18 = 1.0;
            if ((fVar29 != 0.0) || (NAN(fVar29))) {
              fVar18 = (float)(0x5f375a84 - ((uint)fVar29 >> 1));
              fVar18 = (fVar29 * -0.5 * fVar18 * fVar18 + 1.5) * fVar18;
            }
            *(ulong *)((long)pvVar13 + uVar16 * 8) = CONCAT44(fVar18 * -fVar28,fVar18 * fVar27);
            uVar17 = uVar15 + 1;
            uVar16 = uVar15;
          } while (uVar19 != uVar15 + 1);
          uVar17 = (ulong)(points_count - 1);
          uVar16 = 0;
          do {
            uVar1 = *(undefined8 *)((long)pvVar13 + uVar17 * 8);
            uVar2 = *(undefined8 *)((long)pvVar13 + uVar16 * 8);
            fVar27 = ((float)uVar2 + (float)uVar1) * 0.5;
            fVar28 = ((float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20)) * 0.5;
            fVar18 = fVar27 * fVar27 + fVar28 * fVar28;
            if (1e-06 < fVar18) {
              fVar18 = 1.0 / fVar18;
              if (100.0 <= fVar18) {
                fVar18 = 100.0;
              }
              fVar27 = fVar27 * fVar18;
              fVar28 = fVar28 * fVar18;
            }
            color_00.g = fVar25;
            color_00.r = fVar23;
            color_00.a = fVar26;
            color_00.b = fVar24;
            uv = (list->config).null.uv;
            pos.x = points[uVar16].x - fVar27 * 0.5;
            pos.y = points[uVar16].y - fVar28 * 0.5;
            pvVar11 = nk_draw_vertex(pvVar11,(nk_convert_config *)(list->config).vertex_layout,pos,
                                     uv,color_00);
            pos_00.x = points[uVar16].x + fVar27 * 0.5;
            pos_00.y = points[uVar16].y + fVar28 * 0.5;
            color_01.g = fVar25;
            color_01.r = fVar23;
            color_01.b = fVar24;
            color_01.a = 0.0;
            pvVar11 = nk_draw_vertex(pvVar11,(nk_convert_config *)(list->config).vertex_layout,
                                     pos_00,uv,color_01);
            nVar21 = (nk_draw_index)uVar22;
            *pnVar12 = nVar21;
            pnVar12[1] = nVar20 + (short)uVar17 * 2;
            nVar9 = nVar20 + 1 + (short)uVar17 * 2;
            pnVar12[2] = nVar9;
            pnVar12[3] = nVar9;
            pnVar12[4] = nVar21 + 1;
            pnVar12[5] = nVar21;
            pnVar12 = pnVar12 + 6;
            uVar15 = uVar16 + 1;
            uVar22 = uVar22 + 2;
            uVar17 = uVar16;
            uVar16 = uVar15;
          } while (uVar19 != uVar15);
          nk_buffer_reset(list->vertices,NK_BUFFER_FRONT);
          return;
        }
      }
    }
    else {
      uVar19 = (ulong)points_count;
      pvVar11 = nk_draw_list_alloc_vertices(list,uVar19);
      pnVar12 = nk_draw_list_alloc_elements(list,(ulong)(points_count * 3 - 6));
      if (pnVar12 != (nk_draw_index *)0x0 && pvVar11 != (void *)0x0) {
        uVar17 = 0;
        do {
          color_02.g = fVar25;
          color_02.r = fVar23;
          color_02.a = fVar26;
          color_02.b = fVar24;
          pvVar11 = nk_draw_vertex(pvVar11,(nk_convert_config *)(list->config).vertex_layout,
                                   points[uVar17],(list->config).null.uv,color_02);
          uVar17 = uVar17 + 1;
        } while (uVar19 != uVar17);
        iVar10 = uVar22 + 2;
        lVar14 = 0;
        do {
          *(nk_draw_index *)((long)pnVar12 + lVar14) = nVar20;
          *(short *)((long)pnVar12 + lVar14 + 2) = (short)iVar10 + -1;
          *(short *)((long)pnVar12 + lVar14 + 4) = (short)iVar10;
          lVar14 = lVar14 + 6;
          iVar10 = iVar10 + 1;
        } while (uVar19 * 6 + -0xc != lVar14);
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_fill_poly_convex(struct nk_draw_list *list,
    const struct nk_vec2 *points, const unsigned int points_count,
    struct nk_color color, enum nk_anti_aliasing aliasing)
{
    struct nk_colorf col;
    struct nk_colorf col_trans;

    NK_STORAGE const nk_size pnt_align = NK_ALIGNOF(struct nk_vec2);
    NK_STORAGE const nk_size pnt_size = sizeof(struct nk_vec2);
    NK_ASSERT(list);
    if (!list || points_count < 3) return;

#ifdef NK_INCLUDE_COMMAND_USERDATA
    nk_draw_list_push_userdata(list, list->userdata);
#endif

    color.a = (nk_byte)((float)color.a * list->config.global_alpha);
    nk_color_fv(&col.r, color);
    col_trans = col;
    col_trans.a = 0;

    if (aliasing == NK_ANTI_ALIASING_ON) {
        nk_size i = 0;
        nk_size i0 = 0;
        nk_size i1 = 0;

        const float AA_SIZE = 1.0f;
        nk_size vertex_offset = 0;
        nk_size index = list->vertex_count;

        const nk_size idx_count = (points_count-2)*3 + points_count*6;
        const nk_size vtx_count = (points_count*2);

        void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
        nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

        nk_size size = 0;
        struct nk_vec2 *normals = 0;
        unsigned int vtx_inner_idx = (unsigned int)(index + 0);
        unsigned int vtx_outer_idx = (unsigned int)(index + 1);
        if (!vtx || !ids) return;

        /* temporary allocate normals */
        vertex_offset = (nk_size)((nk_byte*)vtx - (nk_byte*)list->vertices->memory.ptr);
        nk_buffer_mark(list->vertices, NK_BUFFER_FRONT);
        size = pnt_size * points_count;
        normals = (struct nk_vec2*) nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT, size, pnt_align);
        if (!normals) return;
        vtx = (void*)((nk_byte*)list->vertices->memory.ptr + vertex_offset);

        /* add elements */
        for (i = 2; i < points_count; i++) {
            ids[0] = (nk_draw_index)(vtx_inner_idx);
            ids[1] = (nk_draw_index)(vtx_inner_idx + ((i-1) << 1));
            ids[2] = (nk_draw_index)(vtx_inner_idx + (i << 1));
            ids += 3;
        }

        /* compute normals */
        for (i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++) {
            struct nk_vec2 p0 = points[i0];
            struct nk_vec2 p1 = points[i1];
            struct nk_vec2 diff = nk_vec2_sub(p1, p0);

            /* vec2 inverted length  */
            float len = nk_vec2_len_sqr(diff);
            if (len != 0.0f)
                len = nk_inv_sqrt(len);
            else len = 1.0f;
            diff = nk_vec2_muls(diff, len);

            normals[i0].x = diff.y;
            normals[i0].y = -diff.x;
        }

        /* add vertices + indexes */
        for (i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++) {
            const struct nk_vec2 uv = list->config.null.uv;
            struct nk_vec2 n0 = normals[i0];
            struct nk_vec2 n1 = normals[i1];
            struct nk_vec2 dm = nk_vec2_muls(nk_vec2_add(n0, n1), 0.5f);
            float dmr2 = dm.x*dm.x + dm.y*dm.y;
            if (dmr2 > 0.000001f) {
                float scale = 1.0f / dmr2;
                scale = NK_MIN(scale, 100.0f);
                dm = nk_vec2_muls(dm, scale);
            }
            dm = nk_vec2_muls(dm, AA_SIZE * 0.5f);

            /* add vertices */
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2_sub(points[i1], dm), uv, col);
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2_add(points[i1], dm), uv, col_trans);

            /* add indexes */
            ids[0] = (nk_draw_index)(vtx_inner_idx+(i1<<1));
            ids[1] = (nk_draw_index)(vtx_inner_idx+(i0<<1));
            ids[2] = (nk_draw_index)(vtx_outer_idx+(i0<<1));
            ids[3] = (nk_draw_index)(vtx_outer_idx+(i0<<1));
            ids[4] = (nk_draw_index)(vtx_outer_idx+(i1<<1));
            ids[5] = (nk_draw_index)(vtx_inner_idx+(i1<<1));
            ids += 6;
        }
        /* free temporary normals + points */
        nk_buffer_reset(list->vertices, NK_BUFFER_FRONT);
    } else {
        nk_size i = 0;
        nk_size index = list->vertex_count;
        const nk_size idx_count = (points_count-2)*3;
        const nk_size vtx_count = points_count;
        void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
        nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

        if (!vtx || !ids) return;
        for (i = 0; i < vtx_count; ++i)
            vtx = nk_draw_vertex(vtx, &list->config, points[i], list->config.null.uv, col);
        for (i = 2; i < points_count; ++i) {
            ids[0] = (nk_draw_index)index;
            ids[1] = (nk_draw_index)(index+ i - 1);
            ids[2] = (nk_draw_index)(index+i);
            ids += 3;
        }
    }
}